

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHeadTrackerDevice.cpp
# Opt level: O1

VRInputDevice *
MinVR::VRFakeHeadTrackerDevice::create
          (VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  VRAnyCoreType VVar6;
  float *pfVar7;
  ostream *poVar8;
  VRFakeHeadTrackerDevice *this;
  VRMatrix4 M1;
  string devNameSpace;
  VRVector3 eye;
  VRVector3 up;
  VRVector3 center;
  VRVector3 z;
  VRMatrix4 headMatrix;
  VRVector3 x;
  VRVector3 y;
  VRMatrix4 lookAtMatrix;
  VRMatrix4 M2;
  string toggleEvent;
  string trackerName;
  undefined1 local_620 [72];
  long *local_5d8;
  long local_5d0;
  long local_5c8 [2];
  undefined1 local_5b8 [8];
  pointer pbStack_5b0;
  pointer local_5a8;
  undefined1 local_598 [8];
  pointer pbStack_590;
  pointer local_588;
  undefined1 local_578 [8];
  pointer pbStack_570;
  pointer local_568;
  undefined1 local_558 [8];
  pointer pbStack_550;
  pointer local_548;
  float local_538;
  float local_534;
  float local_530;
  float local_52c;
  float local_528;
  float local_524;
  float local_520;
  float local_51c;
  undefined1 local_518 [72];
  VRVector3 local_4d0;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [8];
  pointer pbStack_490;
  pointer local_488;
  VRMainInterface *local_448;
  VRVector3 local_440;
  string local_428;
  string local_408;
  string local_3e8;
  undefined1 local_3c8 [8];
  pointer pbStack_3c0;
  pointer local_3b8;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368 [3];
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  VRMatrix4 local_78;
  
  local_5d8 = local_5c8;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_448 = vrMain;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5d8,pcVar2,pcVar2 + nameSpace->_M_string_length);
  pcVar2 = local_518 + 0x10;
  local_518._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"TrackerName","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_5d8,(long)local_5d8 + local_5d0);
  VVar6 = VRDataIndex::getValue(config,(string *)local_518,&local_150,true);
  (*(VVar6.datum)->_vptr_VRDatum[2])(&local_110,VVar6.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_518._0_8_ != pcVar2) {
    operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
  }
  local_518._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"ToggleOnOffEvent","");
  pcVar1 = local_620 + 0x10;
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"Kbd1_Down","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_5d8,(long)local_5d8 + local_5d0);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&local_130,config,(string *)local_518,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
             &local_170,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  if ((pointer)local_518._0_8_ != pcVar2) {
    operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
  }
  local_518._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"TranslationScale","");
  local_620._0_4_ = 0x3f800000;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_5d8,(long)local_5d8 + local_5d0);
  local_51c = VRDataIndex::getValueWithDefault<float>
                        (config,(string *)local_518,(float *)local_620,&local_190,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_518._0_8_ != pcVar2) {
    operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
  }
  local_518._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"RotationScale","");
  local_620._0_4_ = 0x3f800000;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_5d8,(long)local_5d8 + local_5d0);
  local_520 = VRDataIndex::getValueWithDefault<float>
                        (config,(string *)local_518,(float *)local_620,&local_1b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_518._0_8_ != pcVar2) {
    operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
  }
  VRVector3::VRVector3((VRVector3 *)local_620,0.0,0.0,4.0);
  VRMatrix4::translation((VRMatrix4 *)local_518,(VRVector3 *)local_620);
  VRVector3::~VRVector3((VRVector3 *)local_620);
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"HeadMatrix","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_5d8,(long)local_5d8 + local_5d0);
  bVar3 = VRDataIndex::exists(config,(string *)local_620,&local_1d0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  if (bVar3) {
    local_378._0_8_ = local_368;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"HeadMatrix","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_5d8,(long)local_5d8 + local_5d0);
    VVar6 = VRDataIndex::getValue(config,(string *)local_378,&local_1f0,true);
    VRMatrix4::VRMatrix4((VRMatrix4 *)local_620,VVar6);
    VRMatrix4::operator=((VRMatrix4 *)local_518,(VRMatrix4 *)local_620);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_620);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368[0]._M_allocated_capacity + 1);
    }
    goto LAB_00153701;
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"LookAtUp","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_5d8,(long)local_5d8 + local_5d0);
  bVar3 = VRDataIndex::exists(config,(string *)local_620,&local_210,true);
  if (bVar3) {
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"LookAtEye","");
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_408,local_5d8,(long)local_5d8 + local_5d0);
    bVar4 = VRDataIndex::exists(config,&local_3e8,&local_408,true);
    if (!bVar4) goto LAB_00152f87;
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"LookAtCenter","");
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,local_5d8,(long)local_5d8 + local_5d0);
    bVar5 = VRDataIndex::exists(config,&local_428,&local_230,true);
    bVar4 = true;
  }
  else {
LAB_00152f87:
    bVar4 = false;
    bVar5 = false;
  }
  if (bVar4) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  if (bVar5 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning : no HeadMatrix defined for ",0x24);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_5d8,local_5d0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter",0x40);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Using default: ",0xf);
    poVar8 = operator<<((ostream *)&std::cerr,(VRMatrix4 *)local_518);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  else {
    local_620._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"LookAtUp","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,local_5d8,(long)local_5d8 + local_5d0);
    VVar6 = VRDataIndex::getValue(config,(string *)local_620,&local_250,true);
    VRVector3::VRVector3((VRVector3 *)local_598,VVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_620._0_8_ != pcVar1) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
    local_620._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"LookAtEye","");
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_5d8,(long)local_5d8 + local_5d0);
    VVar6 = VRDataIndex::getValue(config,(string *)local_620,&local_270,true);
    VRVector3::VRVector3((VRVector3 *)local_5b8,VVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_620._0_8_ != pcVar1) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
    local_620._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"LookAtCenter","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_5d8,(long)local_5d8 + local_5d0);
    VVar6 = VRDataIndex::getValue(config,(string *)local_620,&local_290,true);
    VRVector3::VRVector3((VRVector3 *)local_578,VVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_620._0_8_ != pcVar1) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
    operator-((VRVector3 *)local_558,(VRVector3 *)local_5b8,(VRVector3 *)local_578);
    VRVector3::normalize((VRVector3 *)local_620,(VRVector3 *)local_558);
    VRVector3::operator=((VRVector3 *)local_558,(VRVector3 *)local_620);
    VRVector3::~VRVector3((VRVector3 *)local_620);
    VRVector3::cross(&local_4d0,(VRVector3 *)local_598,(VRVector3 *)local_558);
    VRVector3::normalize((VRVector3 *)local_620,&local_4d0);
    VRVector3::operator=(&local_4d0,(VRVector3 *)local_620);
    VRVector3::~VRVector3((VRVector3 *)local_620);
    VRVector3::cross(&local_440,(VRVector3 *)local_558,&local_4d0);
    pfVar7 = VRVector3::operator[](&local_4d0,0);
    local_4a8._0_4_ = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_440,0);
    local_4b8._0_4_ = *pfVar7;
    pfVar7 = VRVector3::operator[]((VRVector3 *)local_558,0);
    local_524 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_4d0,1);
    local_528 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_440,1);
    local_52c = *pfVar7;
    pfVar7 = VRVector3::operator[]((VRVector3 *)local_558,1);
    local_530 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_4d0,2);
    local_534 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_440,2);
    local_538 = *pfVar7;
    pfVar7 = VRVector3::operator[]((VRVector3 *)local_558,2);
    VRMatrix4::fromRowMajorElements
              ((VRMatrix4 *)local_620,(float)local_4a8._0_4_,(float)local_4b8._0_4_,local_524,0.0,
               local_528,local_52c,local_530,0.0,local_534,local_538,*pfVar7,0.0,0.0,0.0,0.0,1.0);
    pfVar7 = VRVector3::operator[]((VRVector3 *)local_5b8,0);
    local_4a8 = ZEXT416((uint)*pfVar7);
    pfVar7 = VRVector3::operator[]((VRVector3 *)local_5b8,1);
    local_4b8 = ZEXT416((uint)*pfVar7);
    pfVar7 = VRVector3::operator[]((VRVector3 *)local_5b8,2);
    VRMatrix4::fromRowMajorElements
              ((VRMatrix4 *)local_378,1.0,0.0,0.0,-(float)local_4a8._0_4_,0.0,1.0,0.0,
               -(float)local_4b8._0_4_,0.0,0.0,1.0,-*pfVar7,0.0,0.0,0.0,1.0);
    operator*((VRMatrix4 *)local_3c8,(VRMatrix4 *)local_620,(VRMatrix4 *)local_378);
    VRMatrix4::inverse((VRMatrix4 *)local_498,(VRMatrix4 *)local_3c8);
    VRMatrix4::operator=((VRMatrix4 *)local_518,(VRMatrix4 *)local_498);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_498);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_3c8);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_378);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_620);
    VRVector3::~VRVector3(&local_440);
    VRVector3::~VRVector3(&local_4d0);
    VRVector3::~VRVector3((VRVector3 *)local_558);
    VRVector3::~VRVector3((VRVector3 *)local_578);
    VRVector3::~VRVector3((VRVector3 *)local_5b8);
    VRVector3::~VRVector3((VRVector3 *)local_598);
  }
LAB_00153701:
  local_3c8 = (undefined1  [8])0x0;
  pbStack_3c0 = (pointer)0x0;
  local_3b8 = (pointer)0x0;
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"KbdUp","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"KbdW","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"ForwardKeys","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,local_5d8,(long)local_5d8 + local_5d0);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_498,config,(string *)local_620,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3c8,&local_2b0,true);
  local_368[0]._0_8_ = local_3b8;
  local_378._8_8_ = pbStack_3c0;
  local_378._0_8_ = local_3c8;
  local_3c8 = local_498;
  pbStack_3c0 = pbStack_490;
  local_3b8 = local_488;
  local_498 = (undefined1  [8])0x0;
  pbStack_490 = (pointer)0x0;
  local_488 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_498 = (undefined1  [8])0x0;
  pbStack_490 = (pointer)0x0;
  local_488 = (pointer)0x0;
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"KbdDown","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_498,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"KbdZ","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_498,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"BackKeys","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,local_5d8,(long)local_5d8 + local_5d0);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_598,config,(string *)local_620,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_498,&local_2d0,true);
  local_368[0]._0_8_ = local_488;
  local_378._8_8_ = pbStack_490;
  local_378._0_8_ = local_498;
  local_498 = local_598;
  pbStack_490 = pbStack_590;
  local_488 = local_588;
  local_598 = (undefined1  [8])0x0;
  pbStack_590 = (pointer)0x0;
  local_588 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_598);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_598 = (undefined1  [8])0x0;
  pbStack_590 = (pointer)0x0;
  local_588 = (pointer)0x0;
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"KbdLeft","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_598,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"KbdA","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_598,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"LeftKeys","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_5d8,(long)local_5d8 + local_5d0);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5b8,config,(string *)local_620,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_598,&local_2f0,true);
  local_368[0]._0_8_ = local_588;
  local_378._8_8_ = pbStack_590;
  local_378._0_8_ = local_598;
  local_598 = local_5b8;
  pbStack_590 = pbStack_5b0;
  local_588 = local_5a8;
  local_5b8 = (undefined1  [8])0x0;
  pbStack_5b0 = (pointer)0x0;
  local_5a8 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_5b8 = (undefined1  [8])0x0;
  pbStack_5b0 = (pointer)0x0;
  local_5a8 = (pointer)0x0;
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"KbdRight","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"KbdS","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"RightKeys","");
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_5d8,(long)local_5d8 + local_5d0);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_578,config,(string *)local_620,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5b8,&local_310,true);
  local_368[0]._0_8_ = local_5a8;
  local_378._8_8_ = pbStack_5b0;
  local_378._0_8_ = local_5b8;
  local_5b8 = local_578;
  pbStack_5b0 = pbStack_570;
  local_5a8 = local_568;
  local_578 = (undefined1  [8])0x0;
  pbStack_570 = (pointer)0x0;
  local_568 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_578 = (undefined1  [8])0x0;
  pbStack_570 = (pointer)0x0;
  local_568 = (pointer)0x0;
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"MouseBtnRight","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  local_620._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"MouseRotationKeys","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,local_5d8,(long)local_5d8 + local_5d0);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_558,config,(string *)local_620,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_578,&local_330,true);
  local_368[0]._0_8_ = local_568;
  local_378._8_8_ = pbStack_570;
  local_378._0_8_ = local_578;
  local_578 = local_558;
  pbStack_570 = pbStack_550;
  local_568 = local_548;
  local_558 = (undefined1  [8])0x0;
  pbStack_550 = (pointer)0x0;
  local_548 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar1) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  this = (VRFakeHeadTrackerDevice *)operator_new(0x1b0);
  VRMatrix4::VRMatrix4(&local_78,(VRMatrix4 *)local_518);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_498);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_598);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_578);
  VRFakeHeadTrackerDevice
            (this,&local_110,&local_130,local_51c,local_520,&local_78,&local_d8,&local_f0,&local_90,
             &local_a8,&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  VRMatrix4::~VRMatrix4(&local_78);
  (**local_448->_vptr_VRMainInterface)(local_448,&this->super_VREventHandler);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_598);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_498);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8,local_5c8[0] + 1);
  }
  return &this->super_VRInputDevice;
}

Assistant:

VRInputDevice*
VRFakeHeadTrackerDevice::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {
    std::string devNameSpace = nameSpace;
  
    std::string trackerName = config->getValue("TrackerName", devNameSpace);
    std::string toggleEvent = config->getValueWithDefault("ToggleOnOffEvent", std::string("Kbd1_Down"), devNameSpace);
    float tScale = config->getValueWithDefault("TranslationScale", 1.0f, devNameSpace);
    float rScale = config->getValueWithDefault("RotationScale", 1.0f, devNameSpace);
    
    VRMatrix4 headMatrix = VRMatrix4::translation(VRVector3(0,0,4));
    if (config->exists("HeadMatrix", devNameSpace)){
        headMatrix = config->getValue("HeadMatrix", devNameSpace);
    }
    else if (config->exists("LookAtUp", devNameSpace) && config->exists("LookAtEye", devNameSpace) && config->exists("LookAtCenter", devNameSpace))
    {
        VRVector3 up = config->getValue("LookAtUp", devNameSpace);
        VRVector3 eye = config->getValue("LookAtEye", devNameSpace);
        VRVector3 center = config->getValue("LookAtCenter", devNameSpace);
        
        VRVector3 z = eye - center;
        z = z.normalize();
        VRVector3 x = up.cross(z);
        x = x.normalize();
        VRVector3 y = z.cross(x);
        
        VRMatrix4 M1 = VRMatrix4::fromRowMajorElements(x[0], y[0], z[0], 0,
                                                       x[1], y[1], z[1], 0,
                                                       x[2], y[2], z[2], 0,
                                                       0, 0, 0, 1);
        
        VRMatrix4 M2 = VRMatrix4::fromRowMajorElements(1, 0, 0, -eye[0],
                                                       0, 1, 0, -eye[1],
                                                       0, 0, 1, -eye[2],
                                                       0, 0, 0, 1);
        
        VRMatrix4 lookAtMatrix = M1 * M2;
        headMatrix = lookAtMatrix.inverse();
    }
    else {
        std::cerr << "Warning : no HeadMatrix defined for " << devNameSpace << std::endl;
        std::cerr << "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter" << std::endl;
        std::cerr << "Using default: " << headMatrix << std::endl;
    }
    
    std::vector<std::string> forwardKeys;
    forwardKeys.push_back("KbdUp");
    forwardKeys.push_back("KbdW");
    forwardKeys = config->getValueWithDefault("ForwardKeys", forwardKeys, devNameSpace);
    
    std::vector<std::string> backKeys;
    backKeys.push_back("KbdDown");
    backKeys.push_back("KbdZ");
    backKeys = config->getValueWithDefault("BackKeys", backKeys, devNameSpace);
    
    std::vector<std::string> leftKeys;
    leftKeys.push_back("KbdLeft");
    leftKeys.push_back("KbdA");
    leftKeys = config->getValueWithDefault("LeftKeys", leftKeys, devNameSpace);
    
    std::vector<std::string> rightKeys;
    rightKeys.push_back("KbdRight");
    rightKeys.push_back("KbdS");
    rightKeys = config->getValueWithDefault("RightKeys", rightKeys, devNameSpace);

    std::vector<std::string> mouseRotKeys;
    mouseRotKeys.push_back("MouseBtnRight");
    mouseRotKeys = config->getValueWithDefault("MouseRotationKeys", mouseRotKeys, devNameSpace);
    
    VRFakeHeadTrackerDevice *dev = new VRFakeHeadTrackerDevice(trackerName, toggleEvent, tScale, rScale,
        headMatrix, forwardKeys, backKeys, leftKeys, rightKeys, mouseRotKeys);
    vrMain->addEventHandler(dev);

    return dev;
}